

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Glucose::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,int *size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Clause *pCVar5;
  int iVar6;
  int i;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  this->merges = this->merges + 1;
  iVar4 = (int)((ulong)*(undefined8 *)&_ps->header >> 0x20);
  iVar6 = (int)((ulong)*(undefined8 *)&_qs->header >> 0x20);
  pCVar5 = _qs;
  if (iVar4 < iVar6) {
    pCVar5 = _ps;
    _ps = _qs;
    iVar4 = iVar6;
  }
  iVar4 = iVar4 + -1;
  *size = iVar4;
  for (lVar7 = 0; lVar8 = (long)*(int *)&(pCVar5->header).field_0x4, lVar7 < lVar8;
      lVar7 = lVar7 + 1) {
    uVar1 = *(uint *)(&pCVar5[1].header.field_0x0 + lVar7 * 4);
    iVar6 = (int)uVar1 >> 1;
    if (iVar6 != v) {
      uVar2 = *(uint *)&(_ps->header).field_0x4;
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      uVar9 = 0;
      do {
        if (uVar2 == uVar9) {
          iVar4 = iVar4 + 1;
          *size = iVar4;
          goto LAB_00115baa;
        }
        uVar3 = *(uint *)(&_ps[1].header.field_0x0 + uVar9 * 4);
        uVar9 = uVar9 + 1;
      } while ((int)uVar3 >> 1 != iVar6);
      if ((uVar3 ^ uVar1) == 1) break;
    }
LAB_00115baa:
  }
  return lVar8 <= lVar7;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, int& size)
{
    merges++;

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;
    const Lit*  __ps  = (const Lit*)ps;
    const Lit*  __qs  = (const Lit*)qs;

    size = ps.size()-1;

    for (int i = 0; i < qs.size(); i++){
        if (var(__qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(__ps[j]) == var(__qs[i]))
                    if (__ps[j] == ~__qs[i])
                        return false;
                    else
                        goto next;
            size++;
        }
        next:;
    }

    return true;
}